

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CS248::DynamicScene::Scene::render_splines_at
          (Scene *this,double time,bool pretty,bool useCapsuleRadius)

{
  bool bVar1;
  reference ppSVar2;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  SceneObject *obj_3;
  iterator __end2_3;
  iterator __begin2_3;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2_3;
  GLfloat white [4];
  SceneObject *obj_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2_2;
  Mesh *mesh;
  SceneObject *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2_1;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *__range2;
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  *in_stack_fffffffffffffee8;
  Mesh *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff08;
  SceneObject *pSVar3;
  _Self in_stack_ffffffffffffff10;
  _Self in_stack_ffffffffffffff18;
  undefined8 local_d8;
  undefined8 local_d0;
  SceneObject *local_c8;
  _Self local_c0;
  _Self local_b8;
  long local_b0;
  Mesh *local_a8;
  SceneObject *local_a0;
  _Self local_98;
  _Self local_90;
  long local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  SceneObject *local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  byte local_12;
  byte local_11;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_20 = in_RDI + 0x98;
  local_28._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffee8);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffee8);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    ppSVar2 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffef0);
    local_38 = *ppSVar2;
    Spline<CS248::Vector3D>::evaluate
              ((Spline<CS248::Vector3D> *)in_stack_ffffffffffffff18._M_node,
               (double)in_stack_ffffffffffffff10._M_node,
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    (local_38->position).x = local_50;
    (local_38->position).y = local_48;
    (local_38->position).z = local_40;
    Spline<CS248::Vector3D>::evaluate
              ((Spline<CS248::Vector3D> *)in_stack_ffffffffffffff18._M_node,
               (double)in_stack_ffffffffffffff10._M_node,
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    (local_38->rotation).x = local_68;
    (local_38->rotation).y = local_60;
    (local_38->rotation).z = local_58;
    Spline<CS248::Vector3D>::evaluate
              ((Spline<CS248::Vector3D> *)in_stack_ffffffffffffff18._M_node,
               (double)in_stack_ffffffffffffff10._M_node,
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    (local_38->scale).x = local_80;
    (local_38->scale).y = local_78;
    (local_38->scale).z = local_70;
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffef0);
  }
  local_88 = in_RDI + 0x98;
  local_90._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffee8);
  local_98._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffee8);
  while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
    ppSVar2 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffef0);
    local_a0 = *ppSVar2;
    if (local_a0 == (SceneObject *)0x0) {
      in_stack_fffffffffffffef0 = (Mesh *)0x0;
    }
    else {
      in_stack_fffffffffffffef0 =
           (Mesh *)__dynamic_cast(local_a0,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    local_a8 = in_stack_fffffffffffffef0;
    if (in_stack_fffffffffffffef0 != (Mesh *)0x0) {
      Mesh::linearBlendSkinning(in_stack_fffffffffffffef0,(bool)(local_12 & 1));
    }
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffef0);
  }
  local_b0 = in_RDI + 0x98;
  local_b8._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::begin(in_stack_fffffffffffffee8);
  local_c0._M_node =
       (_Base_ptr)
       std::
       set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
       ::end(in_stack_fffffffffffffee8);
  while (bVar1 = std::operator!=(&local_b8,&local_c0), bVar1) {
    ppSVar2 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffef0);
    local_c8 = *ppSVar2;
    local_d8 = 0x3f8000003f800000;
    local_d0 = 0x3f8000003f800000;
    if (((local_c8->isVisible & 1U) == 0) || ((local_c8->isGhosted & 1U) != 0)) {
      if (((local_c8->isVisible & 1U) != 0) && ((local_c8->isGhosted & 1U) != 0)) {
        glEnable(0xbc0);
        glAlphaFunc(0x3f800000,0x206);
        (*local_c8->_vptr_SceneObject[3])();
        glDisable(0xbc0);
      }
    }
    else if ((local_11 & 1) == 0) {
      (*local_c8->_vptr_SceneObject[1])();
    }
    else {
      (*local_c8->_vptr_SceneObject[2])();
    }
    glLightfv(0x4000,0x1201,&local_d8);
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffef0);
  }
  std::
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::begin(in_stack_fffffffffffffee8);
  std::
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::end(in_stack_fffffffffffffee8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff18,(_Self *)&stack0xffffffffffffff10
                                ), bVar1) {
    ppSVar2 = std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator*
                        ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffef0);
    pSVar3 = *ppSVar2;
    if (((pSVar3->isVisible & 1U) != 0) && ((pSVar3->isGhosted & 1U) != 0)) {
      glEnable(0xbc0);
      glAlphaFunc(0x3f800000,0x201);
      glDepthMask(0);
      (*pSVar3->_vptr_SceneObject[3])();
      glDisable(0xbc0);
      glDepthMask(1);
    }
    std::_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*>::operator++
              ((_Rb_tree_const_iterator<CS248::DynamicScene::SceneObject_*> *)
               in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void Scene::render_splines_at(double time, bool pretty, bool useCapsuleRadius) {
  // Update splines
  for (SceneObject *obj : objects) {
    obj->position = obj->positions.evaluate(time);
    obj->rotation = obj->rotations.evaluate(time);
    obj->scale = obj->scales.evaluate(time);
  }

  // Perform linear blend skinning before rendering
  for (SceneObject *obj : objects) {
    Mesh *mesh = dynamic_cast<Mesh *>(obj);
    if (mesh != nullptr) {
      mesh->linearBlendSkinning(useCapsuleRadius);
    }
  }

  // draw the scene twice using alpha test
  for (SceneObject *obj : objects) {
    GLfloat white[4] = {1., 1., 1., 1.};
    if (obj->isVisible && !obj->isGhosted) {
      (pretty) ? (obj->draw_pretty()) : (obj->draw());
    } else if (obj->isVisible && obj->isGhosted) {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_GEQUAL, 1);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
    }
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
  }

  for (SceneObject *obj : objects) {
    if (obj->isVisible && obj->isGhosted) {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_LESS, 1);
      glDepthMask(GL_FALSE);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
      glDepthMask(GL_TRUE);
    }
  }
}